

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall GdlGlyphDefn::ExplicitPseudos(GdlGlyphDefn *this,PseudoSet *setpglf,bool param_2)

{
  ulong uVar1;
  pointer *pppGVar2;
  pointer ppGVar3;
  iterator __position;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  GdlGlyphDefn *local_8;
  
  if (*(int *)&(this->super_GdlGlyphClassMember).field_0x34 == 5) {
    ppGVar3 = (setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    __position._M_current =
         (setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    bVar7 = (long)__position._M_current - (long)ppGVar3 != 0;
    if (bVar7) {
      uVar5 = (long)__position._M_current - (long)ppGVar3 >> 3;
      if (*ppGVar3 != this) {
        uVar6 = 0;
        do {
          if ((uVar5 + (uVar5 == 0)) - 1 == uVar6) goto LAB_00125fb3;
          uVar1 = uVar6 + 1;
          lVar4 = uVar6 + 1;
          uVar6 = uVar1;
        } while (ppGVar3[lVar4] != this);
        bVar7 = uVar1 < uVar5;
      }
      if (bVar7) {
        return;
      }
    }
LAB_00125fb3:
    if (__position._M_current ==
        (setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = this;
      std::vector<GdlGlyphDefn*,std::allocator<GdlGlyphDefn*>>::_M_realloc_insert<GdlGlyphDefn*>
                ((vector<GdlGlyphDefn*,std::allocator<GdlGlyphDefn*>> *)setpglf,__position,&local_8)
      ;
    }
    else {
      *__position._M_current = this;
      pppGVar2 = &(setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppGVar2 = *pppGVar2 + 1;
    }
  }
  return;
}

Assistant:

void GdlGlyphDefn::ExplicitPseudos(PseudoSet & setpglf, bool /*fProcessClasses*/)
{
	if (m_glft == kglftPseudo)
	{
		Assert(m_pglfOutput);

		// Old std::set implementation:
		//GdlGlyphDefn * p = this;	// kludge until Set can handle const args.
		//setpglf.insert(p);  

		for (size_t i = 0; i < setpglf.size(); i++) {
			if (setpglf[i] == this)
				return;  // already there
		}
		setpglf.push_back(this);
	}
}